

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect_jobserver.c
# Opt level: O3

int posix(char *jobserver,char *message)

{
  int iVar1;
  int write_fd_00;
  undefined8 in_RAX;
  int read_fd;
  int write_fd;
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = __isoc99_sscanf(jobserver,"%d,%d",&local_18,(long)&local_18 + 4);
  if (iVar1 == 2) {
    iVar1 = (int)local_18;
    write_fd_00 = local_18._4_4_;
  }
  else {
    iVar1 = strncmp(jobserver,"fifo:",5);
    if (iVar1 != 0) {
      snprintf(message,0x3ff,"Unrecognized jobserver format: %s\n",jobserver);
      return 1;
    }
    iVar1 = open(jobserver + 5,0);
    local_18 = CONCAT44(local_18._4_4_,iVar1);
    write_fd_00 = open(jobserver + 5,1);
    local_18 = CONCAT44(write_fd_00,(int)local_18);
    iVar1 = (int)local_18;
  }
  iVar1 = test_fd(iVar1,write_fd_00,message);
  return iVar1;
}

Assistant:

int posix(const char* jobserver, char* message)
{
  int read_fd;
  int write_fd;

  // First try to parse as "R,W" file descriptors
  if (sscanf(jobserver, "%d,%d", &read_fd, &write_fd) == 2) {
    return test_fd(read_fd, write_fd, message);
  }

  // Then try to parse as "fifo:PATH"
  if (strncmp(jobserver, "fifo:", 5) == 0) {
    const char* path = jobserver + 5;
    read_fd = open(path, O_RDONLY);
    write_fd = open(path, O_WRONLY);
    return test_fd(read_fd, write_fd, message);
  }

  // We don't understand the format
  snprintf(message, MAX_MESSAGE_LENGTH, "Unrecognized jobserver format: %s\n",
           jobserver);
  return 1;
}